

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t handle_tuning(aom_codec_alg_priv_t_conflict *ctx,av1_extracfg *extra_cfg)

{
  av1_extracfg *extra_cfg_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  
  if ((extra_cfg->tuning == AOM_TUNE_IQ) || (extra_cfg->tuning == AOM_TUNE_SSIMULACRA2)) {
    if ((ctx->cfg).g_usage != 2) {
      return AOM_CODEC_INCAPABLE;
    }
    extra_cfg->enable_qm = 1;
    extra_cfg->qm_min = 2;
    extra_cfg->qm_max = 10;
    extra_cfg->sharpness = 7;
    extra_cfg->dist_metric = AOM_DIST_METRIC_QM_PSNR;
    extra_cfg->enable_cdef = 3;
    extra_cfg->enable_chroma_deltaq = 1;
    extra_cfg->deltaq_mode = '\x06';
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t handle_tuning(aom_codec_alg_priv_t *ctx,
                                     struct av1_extracfg *extra_cfg) {
  if (extra_cfg->tuning == AOM_TUNE_IQ ||
      extra_cfg->tuning == AOM_TUNE_SSIMULACRA2) {
    if (ctx->cfg.g_usage != AOM_USAGE_ALL_INTRA) return AOM_CODEC_INCAPABLE;
    // Enable QMs as they've been found to be beneficial for images, when used
    // with alternative QM formulas:
    // - aom_get_qmlevel_allintra()
    // - aom_get_qmlevel_luma_ssimulacra2()
    // - aom_get_qmlevel_444_chroma()
    extra_cfg->enable_qm = 1;
    extra_cfg->qm_min = QM_FIRST_IQ_SSIMULACRA2;
    extra_cfg->qm_max = QM_LAST_IQ_SSIMULACRA2;
    // We can turn on loop filter sharpness, as frames do not have to serve as
    // references to others.
    extra_cfg->sharpness = 7;
    // Using the QM-PSNR metric was found to be beneficial for images (over the
    // default PSNR metric), as it correlates better with subjective image
    // quality consistency and better SSIMULACRA 2 scores.
    extra_cfg->dist_metric = AOM_DIST_METRIC_QM_PSNR;
    // CDEF_ALL has been found to blur images at medium and high quality
    // qindexes, so let's use a version that adapts CDEF strength on frame
    // qindexes. CDEF_ADAPTIVE strengths look like this for varying qindexes:
    // - CDEF off:          0 -  32
    // - Reduced strength: 33 - 220
    // - Full strength:   221 - 255
    extra_cfg->enable_cdef = CDEF_ADAPTIVE;
    // Enable chroma deltaq so the encoder can factor in chroma subsampling and
    // adjust chroma quality when necessary.
    extra_cfg->enable_chroma_deltaq = 1;
    // Enable "Variance Boost" deltaq mode, optimized for images.
    extra_cfg->deltaq_mode = DELTA_Q_VARIANCE_BOOST;
  }
  return AOM_CODEC_OK;
}